

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::RandomUniformStaticLayerParams::MergePartialFromCodedStream
          (RandomUniformStaticLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  uint8 uVar2;
  byte *pbVar3;
  uint8 *puVar4;
  float *pfVar5;
  bool bVar6;
  uint32 uVar7;
  int iVar8;
  int iVar9;
  char cVar10;
  ulong uVar11;
  pair<unsigned_long,_bool> pVar12;
  float local_40;
  float local_3c;
  RepeatedField<unsigned_long> *local_38;
  
  local_38 = &this->outputshape_;
  do {
    pbVar3 = input->buffer_;
    uVar7 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar1 = *pbVar3;
      uVar7 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003bd1b0;
      input->buffer_ = pbVar3 + 1;
      uVar11 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003bd1b0:
      uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar11 = 0;
      if (uVar7 - 1 < 0x7f) {
        uVar11 = 0x100000000;
      }
      uVar11 = uVar7 | uVar11;
    }
    uVar7 = (uint32)uVar11;
    iVar8 = 6;
    iVar9 = iVar8;
    if ((uVar11 & 0x100000000) == 0) goto switchD_003bd214_default;
    cVar10 = (char)uVar11;
    switch((uint)(uVar11 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar10 != '\b') goto switchD_003bd214_default;
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (uVar2 = *puVar4, -1 < (long)(char)uVar2)) {
        input->buffer_ = puVar4 + 1;
        pVar12._8_8_ = 1;
        pVar12.first = (long)(char)uVar2;
      }
      else {
        pVar12 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
      }
      if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        this->seed_ = pVar12.first;
        goto LAB_003bd1f6;
      }
      break;
    case 2:
      if (cVar10 != '\x15') goto switchD_003bd214_default;
      pfVar5 = (float *)input->buffer_;
      if (*(int *)&input->buffer_end_ - (int)pfVar5 < 4) {
        bVar6 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                          (input,(uint32 *)&local_40);
        if (!bVar6) break;
      }
      else {
        local_40 = *pfVar5;
        input->buffer_ = (uint8 *)(pfVar5 + 1);
      }
      this->minval_ = local_40;
      goto LAB_003bd1f6;
    case 3:
      if (cVar10 == '\x1d') {
        pfVar5 = (float *)input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)pfVar5 < 4) {
          bVar6 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                            (input,(uint32 *)&local_3c);
          if (!bVar6) break;
        }
        else {
          local_3c = *pfVar5;
          input->buffer_ = (uint8 *)(pfVar5 + 1);
        }
        this->maxval_ = local_3c;
        goto LAB_003bd1f6;
      }
    default:
switchD_003bd214_default:
      iVar9 = 7;
      if ((uVar7 & 7) != 4 && uVar7 != 0) {
        bVar6 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar7);
LAB_003bd1ef:
        iVar9 = iVar8;
        if (bVar6 != false) {
LAB_003bd1f6:
          iVar9 = 0;
        }
      }
      break;
    case 4:
      if (cVar10 == ' ') {
        bVar6 = google::protobuf::internal::WireFormatLite::
                ReadRepeatedPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                          (1,0x22,input,local_38);
      }
      else {
        if ((uVar7 & 0xff) != 0x22) goto switchD_003bd214_default;
        bVar6 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                          (input,local_38);
      }
      goto LAB_003bd1ef;
    }
    if (iVar9 != 0) {
      return iVar9 != 6;
    }
  } while( true );
}

Assistant:

bool RandomUniformStaticLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.RandomUniformStaticLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // int64 seed = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &seed_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float minVal = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(21u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &minval_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float maxVal = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(29u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &maxval_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated uint64 outputShape = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, this->mutable_outputshape())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(32u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 1, 34u, input, this->mutable_outputshape())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.RandomUniformStaticLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.RandomUniformStaticLayerParams)
  return false;
#undef DO_
}